

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O1

void testJacobiEigenSolver<Imath_2_5::Matrix33<double>>(Matrix33<double> *A)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  size_t i;
  long lVar15;
  double *pdVar16;
  size_t i_1;
  double (*padVar17) [3];
  size_t j;
  long lVar18;
  double *pdVar19;
  int j_3;
  int k;
  long lVar20;
  double *pdVar21;
  int k_1;
  Matrix33 *pMVar22;
  double dVar23;
  double dVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  Matrix33<double> MS;
  Matrix33<double> tmp;
  Matrix33<double> MA;
  TV S;
  Matrix33<double> V;
  Matrix33<double> AA;
  double local_1f8;
  double dStack_1f0;
  double local_1e8;
  double dStack_1e0;
  double local_1d8;
  double dStack_1d0;
  double local_1c8;
  double dStack_1c0;
  double local_1b8;
  double local_1a8 [10];
  double local_158 [9];
  Vec3 local_110 [24];
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  Matrix33 local_60 [72];
  
  dVar24 = 0.0;
  lVar15 = 0;
  padVar17 = (double (*) [3])A;
  do {
    lVar18 = 0;
    dVar23 = dVar24;
    do {
      dVar24 = ABS((*(double (*) [3])*padVar17)[lVar18]);
      if (dVar24 <= dVar23) {
        dVar24 = dVar23;
      }
      lVar18 = lVar18 + 1;
      dVar23 = dVar24;
    } while (lVar18 != 3);
    lVar15 = lVar15 + 1;
    padVar17 = padVar17 + 1;
  } while (lVar15 != 3);
  dVar23 = 2.220446049250313e-16;
  if (2.220446049250313e-16 <= dVar24) {
    dVar23 = dVar24;
  }
  dVar24 = dVar23 * 100.0 * 2.220446049250313e-16;
  pdVar16 = (double *)A;
  pMVar22 = local_60;
  for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
    *(double *)pMVar22 = *pdVar16;
    pdVar16 = pdVar16 + 1;
    pMVar22 = pMVar22 + 8;
  }
  pMVar22 = (Matrix33 *)&local_f8;
  dStack_f0 = 0.0;
  dStack_d0 = 0.0;
  local_c8 = 0.0;
  dStack_c0 = 0.0;
  local_e8 = 0.0;
  dStack_e0 = 0.0;
  local_f8 = 1.0;
  local_d8 = 1.0;
  local_b8 = 1.0;
  Imath_2_5::jacobiEigenSolver<double>(local_60,local_110,pMVar22,2.220446049250313e-16);
  verifyOrthonormal<Imath_2_5::Matrix33<double>>((Matrix33<double> *)pMVar22,dVar24);
  dVar14 = local_b8;
  dVar13 = dStack_c0;
  dVar12 = local_c8;
  dVar11 = dStack_d0;
  dVar10 = local_d8;
  dVar9 = dStack_e0;
  dVar8 = local_e8;
  dVar7 = dStack_f0;
  dVar23 = local_f8;
  if (dVar24 <= ABS((dStack_e0 * dStack_c0 - local_c8 * local_d8) * local_e8 +
                    (local_d8 * local_b8 - dStack_c0 * dStack_d0) * local_f8 +
                    (dStack_d0 * local_c8 - local_b8 * dStack_e0) * dStack_f0) + -1.0) {
    __assert_fail("abs(V.determinant()) - 1 < threshold",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testJacobiEigenSolver.cpp"
                  ,0x8a,"void testJacobiEigenSolver(const TM &) [TM = Imath_2_5::Matrix33<double>]")
    ;
  }
  pdVar16 = &local_1f8;
  dStack_1f0 = 0.0;
  dStack_1d0 = 0.0;
  local_1c8 = 0.0;
  dStack_1c0 = 0.0;
  local_1e8 = 0.0;
  dStack_1e0 = 0.0;
  local_1f8 = 1.0;
  local_1d8 = 1.0;
  local_1b8 = 1.0;
  lVar15 = 0;
  do {
    lVar18 = 0;
    do {
      uVar25 = 0;
      uVar26 = 0;
      if (lVar15 == lVar18) {
        uVar25 = (undefined4)*(undefined8 *)(local_110 + lVar15 * 8);
        uVar26 = (undefined4)((ulong)*(undefined8 *)(local_110 + lVar15 * 8) >> 0x20);
      }
      pdVar16[lVar18] = (double)CONCAT44(uVar26,uVar25);
      lVar18 = lVar18 + 1;
    } while (lVar18 != 3);
    lVar15 = lVar15 + 1;
    pdVar16 = pdVar16 + 3;
  } while (lVar15 != 3);
  dVar2 = A->x[1][1];
  dVar3 = A->x[1][2];
  dVar4 = A->x[2][1];
  dVar5 = A->x[2][0];
  dVar6 = A->x[1][0];
  dVar1 = A->x[2][2];
  if (ABS(A->x[0][2] * (dVar6 * dVar4 - dVar5 * dVar2) +
          A->x[0][0] * (dVar2 * dVar1 - dVar4 * dVar3) +
          A->x[0][1] * (dVar3 * dVar5 - dVar1 * dVar6)) -
      ABS(local_1e8 * (dStack_1e0 * dStack_1c0 - local_1c8 * local_1d8) +
          local_1f8 * (local_1d8 * local_1b8 - dStack_1c0 * dStack_1d0) +
          dStack_1f0 * (dStack_1d0 * local_1c8 - local_1b8 * dStack_1e0)) < dVar24) {
    local_1a8[6] = 0.0;
    local_1a8[7] = 0.0;
    local_1a8[4] = 0.0;
    local_1a8[5] = 0.0;
    local_1a8[2] = 0.0;
    local_1a8[3] = 0.0;
    local_1a8[0] = 0.0;
    local_1a8[1] = 0.0;
    local_1a8[8] = 0.0;
    lVar15 = 0;
    do {
      lVar18 = 0;
      pdVar16 = &local_1f8;
      do {
        dVar1 = local_1a8[lVar15 * 3 + lVar18];
        lVar20 = 0;
        pdVar19 = pdVar16;
        do {
          dVar1 = dVar1 + *(double *)(pMVar22 + lVar20 * 8) * *pdVar19;
          lVar20 = lVar20 + 1;
          pdVar19 = pdVar19 + 3;
        } while (lVar20 != 3);
        local_1a8[lVar15 * 3 + lVar18] = dVar1;
        lVar18 = lVar18 + 1;
        pdVar16 = pdVar16 + 1;
      } while (lVar18 != 3);
      lVar15 = lVar15 + 1;
      pMVar22 = pMVar22 + 0x18;
    } while (lVar15 != 3);
    local_a8 = dVar23;
    local_a0 = dVar9;
    local_98 = dVar12;
    local_90 = dVar7;
    local_88 = dVar10;
    local_80 = dVar13;
    local_78 = dVar8;
    local_70 = dVar11;
    local_68 = dVar14;
    local_158[0] = 0.0;
    local_158[1] = 0.0;
    local_158[2] = 0.0;
    local_158[3] = 0.0;
    local_158[4] = 0.0;
    local_158[5] = 0.0;
    local_158[6] = 0.0;
    local_158[7] = 0.0;
    local_158[8] = 0.0;
    pdVar16 = local_1a8;
    lVar15 = 0;
    do {
      lVar18 = 0;
      pdVar19 = &local_a8;
      do {
        dVar23 = local_158[lVar15 * 3 + lVar18];
        lVar20 = 0;
        pdVar21 = pdVar19;
        do {
          dVar23 = dVar23 + pdVar16[lVar20] * *pdVar21;
          lVar20 = lVar20 + 1;
          pdVar21 = pdVar21 + 3;
        } while (lVar20 != 3);
        local_158[lVar15 * 3 + lVar18] = dVar23;
        lVar18 = lVar18 + 1;
        pdVar19 = pdVar19 + 1;
      } while (lVar18 != 3);
      lVar15 = lVar15 + 1;
      pdVar16 = pdVar16 + 3;
    } while (lVar15 != 3);
    pdVar16 = local_158;
    lVar15 = 0;
    do {
      lVar18 = 0;
      do {
        if (dVar24 <= ABS((*(double (*) [3])*(double (*) [3])A)[lVar18] - pdVar16[lVar18])) {
          __assert_fail("abs(A[i][j]-MA[i][j]) < threshold",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testJacobiEigenSolver.cpp"
                        ,0x9d,
                        "void testJacobiEigenSolver(const TM &) [TM = Imath_2_5::Matrix33<double>]")
          ;
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != 3);
      lVar15 = lVar15 + 1;
      pdVar16 = pdVar16 + 3;
      A = (Matrix33<double> *)((long)A + 0x18);
    } while (lVar15 != 3);
    return;
  }
  __assert_fail("abs(A.determinant()) - abs(MS.determinant()) < threshold",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testJacobiEigenSolver.cpp"
                ,0x96,"void testJacobiEigenSolver(const TM &) [TM = Imath_2_5::Matrix33<double>]");
}

Assistant:

void
testJacobiEigenSolver(const TM& A)
{
    using std::abs;

    typedef typename TM::BaseType T;
    typedef typename TM::BaseVecType TV;

    const T threshold = computeThreshold(A);

    TM AA(A);
    TV S;
    TM V;

    jacobiEigenSolver(AA, S, V);

    // Orthogonality of V
    verifyOrthonormal(V, threshold);
 
    // Determinant of V
    assert(abs(V.determinant()) - 1 < threshold);

    // Determinant of A and S
    TM MS;
    for (size_t i = 0; i < TM::dimensions(); ++i)
        for (size_t j = 0; j < TM::dimensions(); ++j)
            if(i == j)
                MS[i][j] = S[i];
            else
                MS[i][j] = 0;

    assert(abs(A.determinant()) - abs(MS.determinant()) <
               threshold);

    // A = V * S * V^T
    TM MA = V * MS * V.transposed();

    for (size_t i = 0; i < TM::dimensions(); ++i) 
        for (size_t j =0; j < TM::dimensions(); ++j) 
            assert(abs(A[i][j]-MA[i][j]) < threshold);
}